

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O3

void match(int matches,long limit,int num_robots,string *command1,string *command2,string *command3,
          string *command4,bool outputToStdout,bool outputToFullScreen)

{
  bool bVar1;
  int iVar2;
  __atomic_base<int> _Var3;
  mapped_type *pmVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Result_base *p_Var6;
  int *piVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  uint *puVar12;
  int iVar13;
  _State_baseV2 *__tmp;
  bool bVar14;
  robot *prVar15;
  ulong uVar16;
  long lVar17;
  pointer this;
  undefined1 auVar18 [16];
  vector<std::future<void>,_std::allocator<std::future<void>_>_> allServersThreads;
  int ties [4];
  int wins [4];
  Forth forth4;
  Forth forth3;
  Forth forth2;
  Forth forth1;
  timespec local_2108;
  _func_int **local_20f0 [2];
  __basic_future<void> local_20e0;
  int local_20d0;
  int local_20cc;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> local_20c8;
  ulong local_20b0;
  long *local_20a8;
  long *local_20a0;
  long *local_2098;
  long *local_2090;
  string *local_2088;
  string *local_2080;
  string *local_2078;
  long local_2070;
  long local_2068;
  long local_2060;
  uint local_2058 [4];
  uint local_2048 [6];
  Forth *local_2030 [256];
  Forth *local_1830 [256];
  Forth *local_1030 [256];
  Forth local_830;
  
  LOCK();
  stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  r_debug = 0;
  local_20d0 = matches;
  local_2088 = command3;
  local_2080 = command2;
  local_2078 = command1;
  local_2070 = limit;
  if (0 < num_robots) {
    uVar9 = (ulong)(uint)num_robots;
    memset(local_2048,0,uVar9 * 4);
    memset(local_2058,0,uVar9 * 4);
    if (num_robots != 1) {
      local_20cc = num_robots;
      if (local_20d0 < 1) {
LAB_0010eab8:
        if (!outputToStdout) {
          return;
        }
        match();
        return;
      }
      local_2060 = uVar9 * 0xb8;
      local_2068 = uVar9 - 1;
      local_20b0 = 1;
LAB_0010da8f:
      cppforth::Forth::Forth(&local_830);
      InitForthRobot(&local_830,step);
      local_1030[0] = &local_830;
      pmVar4 = std::
               map<const_cppforth::Forth_*,_int,_std::less<const_cppforth::Forth_*>,_std::allocator<std::pair<const_cppforth::Forth_*const,_int>_>_>
               ::operator[](&Forth2Int,(key_type *)local_1030);
      *pmVar4 = 0;
      cppforth::Forth::Forth((Forth *)local_1030);
      InitForthRobot((Forth *)local_1030,step);
      local_1830[0] = (Forth *)local_1030;
      pmVar4 = std::
               map<const_cppforth::Forth_*,_int,_std::less<const_cppforth::Forth_*>,_std::allocator<std::pair<const_cppforth::Forth_*const,_int>_>_>
               ::operator[](&Forth2Int,(key_type *)local_1830);
      *pmVar4 = 1;
      cppforth::Forth::Forth((Forth *)local_1830);
      InitForthRobot((Forth *)local_1830,step);
      local_2030[0] = (Forth *)local_1830;
      pmVar4 = std::
               map<const_cppforth::Forth_*,_int,_std::less<const_cppforth::Forth_*>,_std::allocator<std::pair<const_cppforth::Forth_*const,_int>_>_>
               ::operator[](&Forth2Int,(key_type *)local_2030);
      *pmVar4 = 2;
      cppforth::Forth::Forth((Forth *)local_2030);
      InitForthRobot((Forth *)local_2030,step);
      local_20c8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_2030;
      pmVar4 = std::
               map<const_cppforth::Forth_*,_int,_std::less<const_cppforth::Forth_*>,_std::allocator<std::pair<const_cppforth::Forth_*const,_int>_>_>
               ::operator[](&Forth2Int,(key_type *)&local_20c8);
      *pmVar4 = 3;
      local_20c8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
      super__Vector_impl_data._M_start = (future<void> *)0x0;
      local_20c8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (future<void> *)0x0;
      local_20c8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2108.tv_sec = 0;
      local_2108.tv_nsec = 0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00157090;
      p_Var5[1]._M_use_count = 0;
      p_Var5[1]._M_weak_count = 0;
      *(undefined4 *)&p_Var5[2]._vptr__Sp_counted_base = 0;
      *(undefined1 *)((long)&p_Var5[2]._vptr__Sp_counted_base + 4) = 0;
      p_Var5[2]._M_use_count = 0;
      p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[3]._M_use_count = 0;
      p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_001570e0;
      p_Var6 = (_Result_base *)operator_new(0x10);
      *(undefined8 *)p_Var6 = 0;
      *(undefined8 *)(p_Var6 + 8) = 0;
      std::__future_base::_Result_base::_Result_base(p_Var6);
      *(undefined ***)p_Var6 = &PTR__M_destroy_00157cd8;
      p_Var5[4]._vptr__Sp_counted_base = (_func_int **)p_Var6;
      *(Forth **)&p_Var5[4]._M_use_count = &local_830;
      p_Var5[5]._vptr__Sp_counted_base = (_func_int **)local_2078;
      local_20f0[0] = (_func_int **)0x0;
      local_20a8 = (long *)operator_new(0x20);
      *local_20a8 = (long)&PTR___State_00157138;
      local_20a8[1] = (long)(p_Var5 + 1);
      local_20a8[2] =
           (long)std::__future_base::
                 _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:233:15)>_>,_void>
                 ::_M_run;
      local_20a8[3] = 0;
      std::thread::_M_start_thread(local_20f0,&local_20a8,0);
      if (local_20a8 != (long *)0x0) {
        (**(code **)(*local_20a8 + 8))();
      }
      if (p_Var5[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
LAB_0010ead6:
        std::terminate();
      }
      p_Var5[3]._vptr__Sp_counted_base = local_20f0[0];
      local_2108.tv_sec = (__time_t)(p_Var5 + 1);
      local_2108.tv_nsec = (long)p_Var5;
      std::__basic_future<void>::__basic_future(&local_20e0,(__state_type *)&local_2108);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec);
      }
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_20c8,
                 (future<void> *)&local_20e0);
      if (local_20e0._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_20e0._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_2108.tv_sec = 0;
      local_2108.tv_nsec = 0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00157210;
      p_Var5[1]._M_use_count = 0;
      p_Var5[1]._M_weak_count = 0;
      *(undefined4 *)&p_Var5[2]._vptr__Sp_counted_base = 0;
      *(undefined1 *)((long)&p_Var5[2]._vptr__Sp_counted_base + 4) = 0;
      p_Var5[2]._M_use_count = 0;
      p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[3]._M_use_count = 0;
      p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00157260;
      p_Var6 = (_Result_base *)operator_new(0x10);
      *(undefined8 *)p_Var6 = 0;
      *(undefined8 *)(p_Var6 + 8) = 0;
      std::__future_base::_Result_base::_Result_base(p_Var6);
      *(undefined ***)p_Var6 = &PTR__M_destroy_00157cd8;
      p_Var5[4]._vptr__Sp_counted_base = (_func_int **)p_Var6;
      *(Forth ***)&p_Var5[4]._M_use_count = local_1030;
      p_Var5[5]._vptr__Sp_counted_base = (_func_int **)local_2080;
      local_20f0[0] = (_func_int **)0x0;
      local_20a0 = (long *)operator_new(0x20);
      *local_20a0 = (long)&PTR___State_001572b8;
      local_20a0[1] = (long)(p_Var5 + 1);
      local_20a0[2] =
           (long)std::__future_base::
                 _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:245:15)>_>,_void>
                 ::_M_run;
      local_20a0[3] = 0;
      std::thread::_M_start_thread(local_20f0,&local_20a0,0);
      if (local_20a0 != (long *)0x0) {
        (**(code **)(*local_20a0 + 8))();
      }
      if (p_Var5[3]._vptr__Sp_counted_base != (_func_int **)0x0) goto LAB_0010ead6;
      p_Var5[3]._vptr__Sp_counted_base = local_20f0[0];
      local_2108.tv_sec = (__time_t)(p_Var5 + 1);
      local_2108.tv_nsec = (long)p_Var5;
      std::__basic_future<void>::__basic_future(&local_20e0,(__state_type *)&local_2108);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec);
      }
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_20c8,
                 (future<void> *)&local_20e0);
      if (local_20e0._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_20e0._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_2108.tv_sec = 0;
      local_2108.tv_nsec = 0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00157390;
      p_Var5[1]._M_use_count = 0;
      p_Var5[1]._M_weak_count = 0;
      *(undefined4 *)&p_Var5[2]._vptr__Sp_counted_base = 0;
      *(undefined1 *)((long)&p_Var5[2]._vptr__Sp_counted_base + 4) = 0;
      p_Var5[2]._M_use_count = 0;
      p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[3]._M_use_count = 0;
      p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_001573e0;
      p_Var6 = (_Result_base *)operator_new(0x10);
      *(undefined8 *)p_Var6 = 0;
      *(undefined8 *)(p_Var6 + 8) = 0;
      std::__future_base::_Result_base::_Result_base(p_Var6);
      *(undefined ***)p_Var6 = &PTR__M_destroy_00157cd8;
      p_Var5[4]._vptr__Sp_counted_base = (_func_int **)p_Var6;
      *(Forth ***)&p_Var5[4]._M_use_count = local_1830;
      p_Var5[5]._vptr__Sp_counted_base = (_func_int **)local_2088;
      local_20f0[0] = (_func_int **)0x0;
      local_2098 = (long *)operator_new(0x20);
      *local_2098 = (long)&PTR___State_00157438;
      local_2098[1] = (long)(p_Var5 + 1);
      local_2098[2] =
           (long)std::__future_base::
                 _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:257:15)>_>,_void>
                 ::_M_run;
      local_2098[3] = 0;
      std::thread::_M_start_thread(local_20f0,&local_2098,0);
      if (local_2098 != (long *)0x0) {
        (**(code **)(*local_2098 + 8))();
      }
      if (p_Var5[3]._vptr__Sp_counted_base != (_func_int **)0x0) goto LAB_0010ead6;
      p_Var5[3]._vptr__Sp_counted_base = local_20f0[0];
      local_2108.tv_sec = (__time_t)(p_Var5 + 1);
      local_2108.tv_nsec = (long)p_Var5;
      std::__basic_future<void>::__basic_future(&local_20e0,(__state_type *)&local_2108);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec);
      }
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_20c8,
                 (future<void> *)&local_20e0);
      if (local_20e0._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_20e0._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_2108.tv_sec = 0;
      local_2108.tv_nsec = 0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00157510;
      p_Var5[1]._M_use_count = 0;
      p_Var5[1]._M_weak_count = 0;
      *(undefined4 *)&p_Var5[2]._vptr__Sp_counted_base = 0;
      *(undefined1 *)((long)&p_Var5[2]._vptr__Sp_counted_base + 4) = 0;
      p_Var5[2]._M_use_count = 0;
      p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[3]._M_use_count = 0;
      p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00157560;
      p_Var6 = (_Result_base *)operator_new(0x10);
      *(undefined8 *)p_Var6 = 0;
      *(undefined8 *)(p_Var6 + 8) = 0;
      std::__future_base::_Result_base::_Result_base(p_Var6);
      *(undefined ***)p_Var6 = &PTR__M_destroy_00157cd8;
      p_Var5[4]._vptr__Sp_counted_base = (_func_int **)p_Var6;
      *(Forth ***)&p_Var5[4]._M_use_count = local_2030;
      p_Var5[5]._vptr__Sp_counted_base = (_func_int **)command4;
      local_20f0[0] = (_func_int **)0x0;
      local_2090 = (long *)operator_new(0x20);
      *local_2090 = (long)&PTR___State_001575b8;
      local_2090[1] = (long)(p_Var5 + 1);
      local_2090[2] =
           (long)std::__future_base::
                 _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:268:15)>_>,_void>
                 ::_M_run;
      local_2090[3] = 0;
      std::thread::_M_start_thread(local_20f0,&local_2090,0);
      if (local_2090 != (long *)0x0) {
        (**(code **)(*local_2090 + 8))();
      }
      if (p_Var5[3]._vptr__Sp_counted_base != (_func_int **)0x0) goto LAB_0010ead6;
      p_Var5[3]._vptr__Sp_counted_base = local_20f0[0];
      local_2108.tv_sec = (__time_t)(p_Var5 + 1);
      local_2108.tv_nsec = (long)p_Var5;
      std::__basic_future<void>::__basic_future(&local_20e0,(__state_type *)&local_2108);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec);
      }
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_20c8,
                 (future<void> *)&local_20e0);
      if (local_20e0._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_20e0._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (outputToStdout) {
        printf("\nMatch %6d: ");
      }
      prVar15 = robots;
      uVar16 = 0;
      do {
        init_robot((int)uVar16);
        prVar15->status = 1;
        uVar16 = uVar16 + 1;
        prVar15 = prVar15 + 1;
      } while (uVar9 != uVar16);
      rand_pos(local_20cc);
      if (local_2070 < 1) {
        lVar17 = 0;
      }
      else {
        iVar13 = 0xf;
        lVar17 = 0;
        do {
          iVar11 = 0;
          prVar15 = robots;
          uVar16 = uVar9;
          do {
            if (prVar15->status == 1) {
              iVar11 = iVar11 + 1;
              cur_robot = prVar15;
            }
            prVar15 = prVar15 + 1;
            uVar16 = uVar16 - 1;
          } while (uVar16 != 0);
          cycle(local_20cc);
          if (outputToFullScreen) {
            update_disp();
            local_2108.tv_sec = 0;
            local_2108.tv_nsec = 1000000;
            do {
              iVar2 = nanosleep(&local_2108,&local_2108);
              if (iVar2 != -1) break;
              piVar7 = __errno_location();
            } while (*piVar7 == 4);
          }
          iVar13 = iVar13 + -1;
          if (iVar13 == 0) {
            move_robots(0);
            move_miss(0);
            lVar17 = lVar17 + 0xf;
            uVar16 = 0;
            do {
              lVar10 = 0;
              bVar1 = true;
              do {
                bVar14 = bVar1;
                if (missiles[uVar16][lVar10].stat == 2) {
                  count_miss((int)uVar16,(int)lVar10);
                }
                lVar10 = 1;
                bVar1 = false;
              } while (bVar14);
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar9);
            iVar13 = 0xf;
          }
        } while ((1 < iVar11) && (lVar17 < local_2070));
      }
      uVar16 = 0;
      bVar1 = false;
      while( true ) {
        do {
          lVar10 = 0;
          bVar14 = true;
          do {
            bVar8 = bVar14;
            if (missiles[uVar16][lVar10].stat == 1) {
              bVar1 = true;
            }
            lVar10 = 1;
            bVar14 = false;
          } while (bVar8);
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar9);
        if (!bVar1) break;
        move_robots(0);
        uVar16 = 0;
        move_miss(0);
        bVar1 = false;
      }
      if (outputToStdout) {
        printf(" cycles = %ld:\n  Survivors:\n",lVar17);
      }
      lVar17 = 0;
      uVar16 = 1;
      iVar13 = 0;
      do {
        if (*(int *)(robots[0].name + lVar17 + -4) == 1) {
          if (outputToStdout) {
            printf("   (%d)%14s: damage=%% %d  ",uVar16,lVar17 + 0x159174,
                   (ulong)*(uint *)(robots[0].name + lVar17 + 0x48));
            putchar((lVar17 == 0xb8) + 9);
          }
          iVar13 = iVar13 + 1;
        }
        uVar16 = (ulong)((int)uVar16 + 1);
        lVar17 = lVar17 + 0xb8;
      } while (local_2060 != lVar17);
      if (iVar13 == 0) {
        if (!outputToStdout) goto LAB_0010e31c;
        puts("mutual destruction");
      }
      else {
        if (!outputToStdout) goto LAB_0010e31c;
        putchar(10);
      }
      puts("  Cumulative score:");
LAB_0010e31c:
      puVar12 = local_2058;
      if (iVar13 == 1) {
        puVar12 = local_2048;
      }
      lVar17 = 0x159174;
      lVar10 = 0;
      do {
        if (*(int *)(lVar17 + -4) == 1) {
          puVar12[lVar10] = puVar12[lVar10] + 1;
        }
        if (outputToStdout) {
          printf("   (%d)%14s: wins=%d ties=%d  ",(ulong)((int)lVar10 + 1),lVar17,
                 (ulong)local_2048[lVar10],(ulong)local_2058[lVar10]);
          putchar((lVar10 == 1) + 9);
          if (local_2068 == lVar10) goto LAB_0010e3ab;
        }
        else if (local_2068 == lVar10) goto LAB_0010e3ba;
        lVar17 = lVar17 + 0xb8;
        lVar10 = lVar10 + 1;
      } while( true );
    }
  }
  if (outputToStdout) {
    match();
  }
  return;
LAB_0010e3ab:
  if (outputToStdout) {
    putchar(10);
  }
LAB_0010e3ba:
  _Var3 = stopAll.super___atomic_base<int>._M_i;
  LOCK();
  stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
  UNLOCK();
  iVar13 = 10000;
  do {
    auVar18._0_4_ = -(uint)(robotStatus[0] == StatusException);
    auVar18._4_4_ = -(uint)(robotStatus[1] == StatusException);
    auVar18._8_4_ = -(uint)(robotStatus[2] == StatusException);
    auVar18._12_4_ = -(uint)(robotStatus[3] == StatusException);
    iVar11 = movmskps(_Var3._M_i,auVar18);
    if (iVar11 == 0xf) break;
    cycle(num_robots);
    _Var3._M_i = sched_yield();
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  this = local_20c8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
  if (local_20c8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_20c8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      std::future<void>::get(this);
      this = this + 1;
    } while (this != local_20c8.
                     super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  }
  LOCK();
  stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&local_20c8);
  cppforth::Forth::~Forth((Forth *)local_2030);
  cppforth::Forth::~Forth((Forth *)local_1830);
  cppforth::Forth::~Forth((Forth *)local_1030);
  cppforth::Forth::~Forth(&local_830);
  iVar13 = (int)local_20b0;
  local_20b0 = (ulong)(iVar13 + 1);
  if (iVar13 == local_20d0) goto LAB_0010eab8;
  goto LAB_0010da8f;
}

Assistant:

void match(int matches,
long limit,
int num_robots,
const std::string &command1,
const std::string &command2,
const std::string &command3,
const std::string &command4,
bool outputToStdout=false,
bool outputToFullScreen=false
)
{
	//int num_robots = 0;
	stopAll.store(0);
	int robotsleft{};
	int m_count{};
	int movement{};
	int i{}, j{}, k{};
	int wins[MAXROBOTS];
	int ties[MAXROBOTS];
	long counter{};

	r_debug = 0;  /* turns off full compile info */

	for (i = 0; i < num_robots; i++) {
		wins[i] = 0;
		ties[i] = 0;
	}
	//num_robots=2;
	if (num_robots < 2) {
		if (outputToStdout) fprintf(stderr, "\n\nCannot play without at least 2 robots.\n\n");
		return;
	}

	for (m_count = 1; m_count <= matches; m_count++) {
		cppforth::Forth forth1{};
		InitForthRobot(forth1);
		InsertForthToInt(&forth1, 0);
		cppforth::Forth forth2{};
		InitForthRobot(forth2);
		InsertForthToInt(&forth2, 1);
		cppforth::Forth forth3{};
		InitForthRobot(forth3);
		InsertForthToInt(&forth3, 2);
		cppforth::Forth forth4{};
		InitForthRobot(forth4);
		InsertForthToInt(&forth4, 3);

		std::vector<std::future<void>> allServersThreads;
		allServersThreads.push_back(
			std::async([&forth1, &command1]{
			try{
				robotStatus[0] = StatusRun;
				forth1.ExecuteString(command1);
				robotStatus[0] = StatusException;
			}
			catch (...){
				robotStatus[0] = StatusException;
			}
		})
			);
		allServersThreads.push_back(
			std::async([&forth2, &command2]{
			try{
				robotStatus[1] = StatusRun;
				forth2.ExecuteString(command2);
				robotStatus[1] = StatusException;
			}
			catch (...){
				robotStatus[1] = StatusException;
			}
		})
			);
		allServersThreads.push_back(
			std::async([&forth3, &command3]{
			try{
				robotStatus[2] = StatusRun;
				forth3.ExecuteString(command3);
				robotStatus[2] = StatusException;
			}
			catch (...){
				robotStatus[2] = StatusException;
			}
		}));
		allServersThreads.push_back(
			std::async([&forth4, &command4]{
			try{
				robotStatus[3] = StatusRun;
				forth4.ExecuteString(command4);
				robotStatus[3] = StatusException;
			}
			catch (...){
				robotStatus[3] = StatusException;
			}
		}));
		if (outputToStdout) printf("\nMatch %6d: ", m_count);
for (i = 0; i < num_robots; i++) {
	init_robot(i);
	// robot_go should be here
	robots[i].status = ACTIVE;
}
rand_pos(num_robots);
movement = MOTION_CYCLES;
robotsleft = num_robots;
counter = 0L;
while (robotsleft > 1 && counter < limit) {
	robotsleft = 0;
	for (i = 0; i < num_robots; i++) {
		if (robots[i].status == ACTIVE) {
			robotsleft++;
			cur_robot = &robots[i];
		}
	}
	cycle(num_robots);
	if (outputToFullScreen) update_disp();
	if (outputToFullScreen) std::this_thread::sleep_for(std::chrono::milliseconds(1));

	if (--movement == 0) {
		counter += MOTION_CYCLES;
		movement = MOTION_CYCLES;
		move_robots(0);
		move_miss(0);
#ifdef DOS
		kbhit();  /* check keyboard so ctrl-break can work */
#endif
		for (i = 0; i < num_robots; i++) {
			for (j = 0; j < MIS_ROBOT; j++) {
				if (missiles[i][j].stat == EXPLODING) {
					count_miss(i, j);
				}
			}
		}
	}
}

/* allow any flying missiles to explode */
while (1) {
	k = 0;
	for (i = 0; i < num_robots; i++) {
		for (j = 0; j < MIS_ROBOT; j++) {
			if (missiles[i][j].stat == FLYING) {
				k = 1;
			}
		}
	}
	if (k) {
		move_robots(0);
		move_miss(0);
	}
	else
		break;
}

if (outputToStdout) printf(" cycles = %ld:\n  Survivors:\n", counter);

k = 0;
for (i = 0; i < num_robots; i++) {
	if (robots[i].status == ACTIVE) {
		if (outputToStdout) 
			printf("   (%d)%14s: damage=%% %d  ", i + 1, robots[i].name,
			robots[i].damage);
    if (i == 1) {
      if (outputToStdout) printf("\n");
    }
    else {
      if (outputToStdout) printf("\t");
    }
		k++;
	}
}

if (k == 0) {
	if (outputToStdout) printf("mutual destruction\n");
}
else {
	if (outputToStdout) printf("\n");
}

if (outputToStdout) printf("  Cumulative score:\n");
for (i = 0; i < num_robots; i++) {
	if (robots[i].status == ACTIVE) {
		if (k == 1)
			wins[i]++;
		else
			ties[i]++;
	}
	if (outputToStdout) printf("   (%d)%14s: wins=%d ties=%d  ", i + 1, robots[i].name,
		wins[i], ties[i]);
  if (i == 1) {
    if (outputToStdout) printf("\n");
  }
  else {
    if (outputToStdout) printf("\t");
  }
}
if (outputToStdout) printf("\n");
stopAll.store(1);
for (int i = 0; i < 10000; ++i){
	auto end = true;
	for (j = 0; j < 4; ++j){
		if (robotStatus[j] != StatusException){
			end = false;
		}
	}
	if (end) 
		break;
	cycle(num_robots);
	std::this_thread::yield();
}
		for (auto it = begin(allServersThreads); it != end(allServersThreads); ++it){
			try{
				(*it).get();
			}
			catch (std::exception &){
				;
			}
		}
		stopAll.store(0);
	}
	if (outputToStdout) fprintf(stderr, "\nMatch play finished.\n\n");
	return ;

}